

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  int over;
  int i;
  int *overflow_local;
  uchar *b32_local;
  secp256k1_scalar *r_local;
  
  over = 0;
  *r = 0;
  for (i = 0; i < 0x20; i = i + 1) {
    *r = *r * 0x100 + (uint)b32[i];
    if (0xc < *r) {
      over = 1;
      *r = *r % 0xd;
    }
  }
  if (overflow != (int *)0x0) {
    *overflow = over;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int i;
    int over = 0;
    *r = 0;
    for (i = 0; i < 32; i++) {
        *r = (*r * 0x100) + b32[i];
        if (*r >= EXHAUSTIVE_TEST_ORDER) {
            over = 1;
            *r %= EXHAUSTIVE_TEST_ORDER;
        }
    }
    if (overflow) *overflow = over;
}